

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O2

void test_decimal128_to_string__zeros(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  bson_decimal128_t neg_exp_zero;
  bson_decimal128_t pos_exp_zero;
  char bid_string [43];
  bson_decimal128_t zero;
  
  zero.high = 0x3040000000000000;
  zero.low = 0;
  pos_exp_zero.high = 0x3298000000000000;
  pos_exp_zero.low = 0;
  neg_exp_zero.high = 0x2b90000000000000;
  neg_exp_zero.low = 0;
  bson_decimal128_to_string(&zero,bid_string);
  if (bid_string._0_2_ == 0x30) {
    bson_decimal128_to_string(&pos_exp_zero,bid_string);
    iVar1 = bcmp("0E+300",bid_string,7);
    if (iVar1 == 0) {
      bson_decimal128_to_string(&neg_exp_zero,bid_string);
      iVar1 = bcmp("0E-600",bid_string,7);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = "!strcmp (\"0E-600\", bid_string)";
      uVar2 = 0x107;
    }
    else {
      pcVar3 = "!strcmp (\"0E+300\", bid_string)";
      uVar2 = 0x104;
    }
  }
  else {
    pcVar3 = "!strcmp (\"0\", bid_string)";
    uVar2 = 0x101;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-decimal128.c"
          ,uVar2,"test_decimal128_to_string__zeros",pcVar3);
  abort();
}

Assistant:

static void
test_decimal128_to_string__zeros (void)
{
   char bid_string[BSON_DECIMAL128_STRING];

   bson_decimal128_t zero;         /* 0 */
   bson_decimal128_t pos_exp_zero; /* 0E+300 */
   bson_decimal128_t neg_exp_zero; /* 0E-600 */

   DECIMAL128_FROM_ULLS (zero, 0x3040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (pos_exp_zero, 0x3298000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (neg_exp_zero, 0x2b90000000000000, 0x0000000000000000);

   bson_decimal128_to_string (&zero, bid_string);
   BSON_ASSERT (!strcmp ("0", bid_string));

   bson_decimal128_to_string (&pos_exp_zero, bid_string);
   BSON_ASSERT (!strcmp ("0E+300", bid_string));

   bson_decimal128_to_string (&neg_exp_zero, bid_string);
   BSON_ASSERT (!strcmp ("0E-600", bid_string));
}